

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O3

size_t __thiscall
libchars::edit_object::render(edit_object *this,size_t buf_idx,size_t limit,string *sequence)

{
  if ((limit == 0) || (this->buflen <= buf_idx)) {
    sequence->_M_string_length = 0;
    *(sequence->_M_dataplus)._M_p = '\0';
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)sequence,0,(char *)sequence->_M_string_length,(ulong)this->buffer);
  }
  return sequence->_M_string_length;
}

Assistant:

virtual size_t render(size_t buf_idx, size_t limit, std::string &sequence)
        {
            //NOTE: return number of *displayed* characters, which might
            // be different from sequence.length() (e.g. if color used)
            if (limit > 0 && buf_idx < buflen) 
                sequence.assign(buffer, buflen-buf_idx);
            else 
                sequence.clear();
            return sequence.length();
        }